

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::function_signature<void(*)(std::__cxx11::string&,int)>
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int
                **f)

{
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int **f_local;
  
  Function_Signature<void,chaiscript::dispatch::detail::Function_Params<std::__cxx11::string&,int>,false,false,false,false>
  ::Function_Signature<void(*const&)(std::__cxx11::string&,int)>
            ((Function_Signature<void,chaiscript::dispatch::detail::Function_Params<std::__cxx11::string&,int>,false,false,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }